

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SegReaderNext(Fts3Table *p,Fts3SegReader *pReader,int bIncr)

{
  Fts3HashElem *pFVar1;
  int *piVar2;
  int iVar3;
  char *pcVar4;
  sqlite3_uint64 n;
  long iBlockid;
  int local_9c;
  int local_98;
  int local_94;
  int *local_90;
  char *zNew;
  i64 nNew;
  int nCopy;
  PendingList *pList;
  char *aCopy;
  Fts3HashElem *pElem;
  int nSuffix;
  int nPrefix;
  char *pNext;
  int rc;
  int bIncr_local;
  Fts3SegReader *pReader_local;
  Fts3Table *p_local;
  
  if (pReader->aDoclist == (char *)0x0) {
    _nSuffix = (byte *)pReader->aNode;
  }
  else {
    _nSuffix = (byte *)(pReader->aDoclist + pReader->nDoclist);
  }
  pNext._4_4_ = bIncr;
  _rc = pReader;
  pReader_local = (Fts3SegReader *)p;
  if ((_nSuffix == (byte *)0x0) || (pReader->aNode + pReader->nNode <= _nSuffix)) {
    if (pReader->ppNextElem != (Fts3HashElem **)0x0) {
      pFVar1 = *pReader->ppNextElem;
      sqlite3_free(pReader->aNode);
      _rc->aNode = (char *)0x0;
      if (pFVar1 != (Fts3HashElem *)0x0) {
        piVar2 = (int *)pFVar1->data;
        iVar3 = *piVar2 + 1;
        _rc->zTerm = (char *)pFVar1->pKey;
        _rc->nTerm = pFVar1->nKey;
        pcVar4 = (char *)sqlite3_malloc(iVar3);
        if (pcVar4 == (char *)0x0) {
          return 7;
        }
        memcpy(pcVar4,*(void **)(piVar2 + 2),(long)iVar3);
        _rc->nDoclist = iVar3;
        _rc->nNode = iVar3;
        _rc->aDoclist = pcVar4;
        _rc->aNode = pcVar4;
        _rc->ppNextElem = _rc->ppNextElem + 1;
      }
      return 0;
    }
    fts3SegReaderSetEof(pReader);
    if (_rc->iLeafEndBlock <= _rc->iCurrentBlock) {
      return 0;
    }
    iBlockid = _rc->iCurrentBlock + 1;
    _rc->iCurrentBlock = iBlockid;
    if (pNext._4_4_ == 0) {
      local_90 = (int *)0x0;
    }
    else {
      local_90 = &_rc->nPopulate;
    }
    iVar3 = sqlite3Fts3ReadBlock
                      ((Fts3Table *)pReader_local,iBlockid,&_rc->aNode,&_rc->nNode,local_90);
    if (iVar3 != 0) {
      return iVar3;
    }
    if ((pNext._4_4_ != 0) && (_rc->nPopulate < _rc->nNode)) {
      _rc->pBlob = (sqlite3_blob *)pReader_local[3].ppNextElem;
      pReader_local[3].ppNextElem = (Fts3HashElem **)0x0;
    }
    _nSuffix = (byte *)_rc->aNode;
    pNext._0_4_ = 0;
  }
  pNext._0_4_ = fts3SegReaderRequire(_rc,(char *)_nSuffix,0x14);
  p_local._4_4_ = (int)pNext;
  if ((int)pNext == 0) {
    if ((*_nSuffix & 0x80) == 0) {
      pElem._4_4_ = (uint)*_nSuffix;
      local_94 = 1;
    }
    else {
      local_94 = sqlite3Fts3GetVarint32((char *)_nSuffix,(int *)((long)&pElem + 4));
    }
    _nSuffix = _nSuffix + local_94;
    if ((*_nSuffix & 0x80) == 0) {
      pElem._0_4_ = (uint)*_nSuffix;
      local_98 = 1;
    }
    else {
      local_98 = sqlite3Fts3GetVarint32((char *)_nSuffix,(int *)&pElem);
    }
    _nSuffix = _nSuffix + local_98;
    if ((((int)(uint)pElem < 1) ||
        ((long)(_rc->aNode + ((long)_rc->nNode - (long)_nSuffix)) < (long)(int)(uint)pElem)) ||
       (_rc->nTermAlloc < (int)pElem._4_4_)) {
      p_local._4_4_ = 0x10b;
    }
    else {
      if ((long)_rc->nTermAlloc < (long)(int)pElem._4_4_ + (long)(int)(uint)pElem) {
        n = ((long)(int)pElem._4_4_ + (long)(int)(uint)pElem) * 2;
        pcVar4 = (char *)sqlite3_realloc64(_rc->zTerm,n);
        if (pcVar4 == (char *)0x0) {
          return 7;
        }
        _rc->zTerm = pcVar4;
        _rc->nTermAlloc = (int)n;
      }
      pNext._0_4_ = fts3SegReaderRequire(_rc,(char *)_nSuffix,(uint)pElem + 10);
      p_local._4_4_ = (int)pNext;
      if ((int)pNext == 0) {
        memcpy(_rc->zTerm + (int)pElem._4_4_,_nSuffix,(long)(int)(uint)pElem);
        _rc->nTerm = pElem._4_4_ + (uint)pElem;
        _nSuffix = _nSuffix + (int)(uint)pElem;
        if ((*_nSuffix & 0x80) == 0) {
          _rc->nDoclist = (uint)*_nSuffix;
          local_9c = 1;
        }
        else {
          local_9c = sqlite3Fts3GetVarint32((char *)_nSuffix,&_rc->nDoclist);
        }
        _rc->aDoclist = (char *)(_nSuffix + local_9c);
        _rc->pOffsetList = (char *)0x0;
        if (((long)_rc->nNode - ((long)_rc->aDoclist - (long)_rc->aNode) < (long)_rc->nDoclist) ||
           ((_rc->nPopulate == 0 && (_rc->aDoclist[_rc->nDoclist + -1] != '\0')))) {
          p_local._4_4_ = 0x10b;
        }
        else {
          p_local._4_4_ = 0;
        }
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

static int fts3SegReaderNext(
  Fts3Table *p, 
  Fts3SegReader *pReader,
  int bIncr
){
  int rc;                         /* Return code of various sub-routines */
  char *pNext;                    /* Cursor variable */
  int nPrefix;                    /* Number of bytes in term prefix */
  int nSuffix;                    /* Number of bytes in term suffix */

  if( !pReader->aDoclist ){
    pNext = pReader->aNode;
  }else{
    pNext = &pReader->aDoclist[pReader->nDoclist];
  }

  if( !pNext || pNext>=&pReader->aNode[pReader->nNode] ){

    if( fts3SegReaderIsPending(pReader) ){
      Fts3HashElem *pElem = *(pReader->ppNextElem);
      sqlite3_free(pReader->aNode);
      pReader->aNode = 0;
      if( pElem ){
        char *aCopy;
        PendingList *pList = (PendingList *)fts3HashData(pElem);
        int nCopy = pList->nData+1;
        pReader->zTerm = (char *)fts3HashKey(pElem);
        pReader->nTerm = fts3HashKeysize(pElem);
        aCopy = (char*)sqlite3_malloc(nCopy);
        if( !aCopy ) return SQLITE_NOMEM;
        memcpy(aCopy, pList->aData, nCopy);
        pReader->nNode = pReader->nDoclist = nCopy;
        pReader->aNode = pReader->aDoclist = aCopy;
        pReader->ppNextElem++;
        assert( pReader->aNode );
      }
      return SQLITE_OK;
    }

    fts3SegReaderSetEof(pReader);

    /* If iCurrentBlock>=iLeafEndBlock, this is an EOF condition. All leaf 
    ** blocks have already been traversed.  */
#ifdef CORRUPT_DB
    assert( pReader->iCurrentBlock<=pReader->iLeafEndBlock || CORRUPT_DB );
#endif
    if( pReader->iCurrentBlock>=pReader->iLeafEndBlock ){
      return SQLITE_OK;
    }

    rc = sqlite3Fts3ReadBlock(
        p, ++pReader->iCurrentBlock, &pReader->aNode, &pReader->nNode, 
        (bIncr ? &pReader->nPopulate : 0)
    );
    if( rc!=SQLITE_OK ) return rc;
    assert( pReader->pBlob==0 );
    if( bIncr && pReader->nPopulate<pReader->nNode ){
      pReader->pBlob = p->pSegments;
      p->pSegments = 0;
    }
    pNext = pReader->aNode;
  }

  assert( !fts3SegReaderIsPending(pReader) );

  rc = fts3SegReaderRequire(pReader, pNext, FTS3_VARINT_MAX*2);
  if( rc!=SQLITE_OK ) return rc;
  
  /* Because of the FTS3_NODE_PADDING bytes of padding, the following is 
  ** safe (no risk of overread) even if the node data is corrupted. */
  pNext += fts3GetVarint32(pNext, &nPrefix);
  pNext += fts3GetVarint32(pNext, &nSuffix);
  if( nSuffix<=0 
   || (&pReader->aNode[pReader->nNode] - pNext)<nSuffix
   || nPrefix>pReader->nTermAlloc
  ){
    return FTS_CORRUPT_VTAB;
  }

  /* Both nPrefix and nSuffix were read by fts3GetVarint32() and so are
  ** between 0 and 0x7FFFFFFF. But the sum of the two may cause integer
  ** overflow - hence the (i64) casts.  */
  if( (i64)nPrefix+nSuffix>(i64)pReader->nTermAlloc ){
    i64 nNew = ((i64)nPrefix+nSuffix)*2;
    char *zNew = sqlite3_realloc64(pReader->zTerm, nNew);
    if( !zNew ){
      return SQLITE_NOMEM;
    }
    pReader->zTerm = zNew;
    pReader->nTermAlloc = nNew;
  }

  rc = fts3SegReaderRequire(pReader, pNext, nSuffix+FTS3_VARINT_MAX);
  if( rc!=SQLITE_OK ) return rc;

  memcpy(&pReader->zTerm[nPrefix], pNext, nSuffix);
  pReader->nTerm = nPrefix+nSuffix;
  pNext += nSuffix;
  pNext += fts3GetVarint32(pNext, &pReader->nDoclist);
  pReader->aDoclist = pNext;
  pReader->pOffsetList = 0;

  /* Check that the doclist does not appear to extend past the end of the
  ** b-tree node. And that the final byte of the doclist is 0x00. If either 
  ** of these statements is untrue, then the data structure is corrupt.
  */
  if( pReader->nDoclist > pReader->nNode-(pReader->aDoclist-pReader->aNode)
   || (pReader->nPopulate==0 && pReader->aDoclist[pReader->nDoclist-1])
  ){
    return FTS_CORRUPT_VTAB;
  }
  return SQLITE_OK;
}